

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# large.c
# Opt level: O2

void duckdb_je_large_dalloc(tsdn_t *tsdn,edata_t *edata)

{
  arena_t *arena;
  _Bool _Var1;
  undefined1 delay_trigger;
  
  arena = (arena_t *)duckdb_je_arenas[(uint)edata->e_bits & 0xfff].repr;
  delay_trigger = 0;
  large_dalloc_prep_impl(tsdn,arena,edata,false);
  large_dalloc_finish_impl(tsdn,arena,edata);
  if (tsdn != (tsdn_t *)0x0) {
    _Var1 = ticker_geom_ticks(&(tsdn->tsd).
                               cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker
                              ,&(tsdn->tsd).
                                cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state,
                              (uint)('\0' < (tsdn->tsd).
                                            cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level
                                    ),(_Bool)delay_trigger);
    if (_Var1) {
      duckdb_je_arena_decay(tsdn,arena,false,false);
      return;
    }
  }
  return;
}

Assistant:

void
large_dalloc(tsdn_t *tsdn, edata_t *edata) {
	arena_t *arena = arena_get_from_edata(edata);
	large_dalloc_prep_impl(tsdn, arena, edata, false);
	large_dalloc_finish_impl(tsdn, arena, edata);
	arena_decay_tick(tsdn, arena);
}